

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sjio.cpp
# Opt level: O0

void ReadBufLine(bool Parse,bool SplitByColon)

{
  uint32_t uVar1;
  char cVar2;
  char cVar3;
  byte bVar4;
  bool bVar5;
  int iVar6;
  char *pcVar7;
  reference pvVar8;
  size_t sVar9;
  bool bVar10;
  bool bVar11;
  size_t local_40;
  bool local_31;
  char local_2f;
  bool local_24;
  bool local_21;
  size_t advanceColumns;
  char CRLFtest_1;
  int escaped;
  bool quotes;
  char CRLFtest;
  bool afterNonAlphaNumNext;
  bool afterNonAlphaNum;
  bool IsLabel;
  bool SplitByColon_local;
  bool Parse_local;
  
  line[0] = '\0';
  while( true ) {
    local_21 = false;
    if (IsRunning != 0) {
      local_21 = ReadBufData();
    }
    if (local_21 == false) {
      return;
    }
    rlppos = line;
    substitutedLine = line;
    eolComment = (char *)0x0;
    bVar10 = (colonSubline & 1U) == 0;
    if (!bVar10) {
      colonSubline = false;
      rlppos = line + 1;
      line[0] = ' ';
    }
    escaped._1_1_ = bVar10 && blockComment == 0;
    bVar10 = true;
    while( true ) {
      bVar5 = ReadBufData();
      bVar11 = false;
      if (((((bVar5) && (bVar11 = false, *rlpbuf != '\n')) && (bVar11 = false, *rlpbuf != '\r')) &&
          ((bVar11 = true, blockComment == 0 && (bVar11 = true, SplitByColon)))) &&
         (bVar11 = true, rlppos != line)) {
        bVar11 = *rlpbuf != ':';
      }
      if (!bVar11) break;
      cVar2 = *rlpbuf;
      rlpbuf = rlpbuf + 1;
      *rlppos = cVar2;
      iVar6 = isalnum((uint)(byte)*rlppos);
      bVar11 = iVar6 == 0;
      if (((*rlppos == '\\') && (bVar5 = ReadBufData(), bVar5)) &&
         ((*rlpbuf == '\r' || (*rlpbuf == '\n')))) {
        bVar4 = *rlpbuf;
        rlpbuf = rlpbuf + 1;
        bVar10 = ReadBufData();
        if ((bVar10) && ((bVar4 ^ 7) == *rlpbuf)) {
          rlpbuf = rlpbuf + 1;
        }
        pvVar8 = std::vector<TextFilePos,_std::allocator<TextFilePos>_>::back(&sourcePosStack);
        TextFilePos::nextSegment(pvVar8,false,0);
        bVar10 = bVar11;
      }
      else if (((*rlppos == '*') && (bVar5 = ReadBufData(), bVar5)) && (*rlpbuf == '/')) {
        if (0 < blockComment) {
          blockComment = blockComment + -1;
        }
        pcVar7 = rlppos + 1;
        cVar2 = *rlpbuf;
        rlppos = rlppos + 2;
        rlpbuf = rlpbuf + 1;
        *pcVar7 = cVar2;
        bVar10 = bVar11;
      }
      else if (((*rlppos == '/') && (bVar5 = ReadBufData(), bVar5)) && (*rlpbuf == '*')) {
        pcVar7 = rlppos + 1;
        blockComment = blockComment + 1;
        cVar2 = *rlpbuf;
        rlppos = rlppos + 2;
        rlpbuf = rlpbuf + 1;
        *pcVar7 = cVar2;
        bVar10 = bVar11;
      }
      else if (blockComment == 0) {
        local_24 = false;
        if (escaped._1_1_) {
          iVar6 = islabchar(*rlppos);
          local_24 = iVar6 != 0;
        }
        escaped._1_1_ = local_24;
        if (local_24) {
          rlppos = rlppos + 1;
          bVar10 = ReadBufData();
          if ((bVar10) && (*rlpbuf == '+')) {
            escaped._1_1_ = false;
            cVar2 = *rlpbuf;
            rlpbuf = rlpbuf + 1;
            pcVar7 = rlppos + 1;
            *rlppos = cVar2;
            rlppos = pcVar7;
            bVar10 = ReadBufData();
            if ((bVar10) && ((iVar6 = isdigit((uint)(byte)*rlpbuf), iVar6 != 0 || (*rlpbuf == '*')))
               ) {
              cVar2 = *rlpbuf;
              rlpbuf = rlpbuf + 1;
              pcVar7 = rlppos + 1;
              *rlppos = cVar2;
              rlppos = pcVar7;
            }
          }
          bVar5 = ReadBufData();
          bVar10 = bVar11;
          if ((bVar5) && (*rlpbuf == ':')) {
            cVar2 = *rlpbuf;
            rlpbuf = rlpbuf + 1;
            pcVar7 = rlppos + 1;
            *rlppos = cVar2;
            rlppos = pcVar7;
            escaped._1_1_ = false;
          }
        }
        else if ((*rlppos == ';') ||
                (((*rlppos == '/' && (bVar5 = ReadBufData(), bVar5)) && (*rlpbuf == '/')))) {
          eolComment = rlppos;
          rlppos = rlppos + 1;
          while( true ) {
            bVar10 = ReadBufData();
            bVar5 = false;
            if ((bVar10) && (bVar5 = false, *rlpbuf != '\n')) {
              bVar5 = *rlpbuf != '\r';
            }
            bVar10 = bVar11;
            if (!bVar5) break;
            cVar2 = *rlpbuf;
            rlpbuf = rlpbuf + 1;
            pcVar7 = rlppos + 1;
            *rlppos = cVar2;
            rlppos = pcVar7;
          }
        }
        else if ((bVar10) && ((*rlppos == '\"' || (*rlppos == '\'')))) {
          cVar2 = *rlppos;
          advanceColumns._4_4_ = 0;
          do {
            if (advanceColumns._4_4_ != 0) {
              advanceColumns._4_4_ = advanceColumns._4_4_ + -1;
            }
            rlppos = rlppos + 1;
            bVar10 = ReadBufData();
            if (bVar10) {
              cVar3 = *rlpbuf;
            }
            else {
              cVar3 = '\0';
            }
            *rlppos = cVar3;
            if (((*rlppos == '\0') || (*rlppos == '\r')) || (*rlppos == '\n')) {
              *rlppos = '\0';
            }
            else {
              rlpbuf = rlpbuf + 1;
            }
            if (((cVar2 == '\"') && (advanceColumns._4_4_ == 0)) && (*rlppos == '\\')) {
              advanceColumns._4_4_ = 2;
            }
            bVar10 = false;
            if ((*rlppos != '\0') && (bVar10 = true, advanceColumns._4_4_ == 0)) {
              local_2f = '\"';
              if (cVar2 != '\"') {
                local_2f = '\'';
              }
              bVar10 = local_2f != *rlppos;
            }
          } while (bVar10);
          bVar10 = bVar11;
          if (*rlppos != '\0') {
            rlppos = rlppos + 1;
          }
        }
        else {
          rlppos = rlppos + 1;
          bVar10 = bVar11;
        }
      }
      else {
        rlppos = rlppos + 1;
        bVar10 = bVar11;
      }
    }
    *rlppos = '\0';
    bVar10 = ReadBufData();
    if ((bVar10) && ((*rlpbuf == '\r' || (*rlpbuf == '\n')))) {
      bVar4 = *rlpbuf;
      rlpbuf = rlpbuf + 1;
      bVar10 = ReadBufData();
      if ((bVar10) && ((bVar4 ^ 7) == *rlpbuf)) {
        rlpbuf = rlpbuf + 1;
      }
      bVar10 = ReadBufData();
      if ((!bVar10) && (line[0] != '\0')) {
        pcVar7 = rlpbuf_end + 1;
        *rlpbuf_end = '\n';
        rlpbuf_end = pcVar7;
      }
    }
    else {
      local_31 = false;
      if (SplitByColon) {
        bVar10 = ReadBufData();
        local_31 = false;
        if ((bVar10) && (local_31 = false, *rlpbuf == ':')) {
          rlpbuf = rlpbuf + 1;
          local_31 = rlpbuf != (char *)0x0;
        }
      }
      colonSubline = local_31;
    }
    bVar10 = std::vector<TextFilePos,_std::allocator<TextFilePos>_>::empty(&sourcePosStack);
    if (((bVar10 ^ 0xffU) & 1) == 0) break;
    if ((colonSubline & 1U) == 0) {
      local_40 = 0;
    }
    else {
      pvVar8 = std::vector<TextFilePos,_std::allocator<TextFilePos>_>::back(&sourcePosStack);
      uVar1 = pvVar8->colEnd;
      sVar9 = strlen(line);
      local_40 = (uVar1 == 0) + sVar9;
    }
    pvVar8 = std::vector<TextFilePos,_std::allocator<TextFilePos>_>::back(&sourcePosStack);
    TextFilePos::nextSegment(pvVar8,(bool)(colonSubline & 1),local_40);
    if (!Parse) {
      return;
    }
    ParseLine(true);
  }
  __assert_fail("!sourcePosStack.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/z00m128[P]sjasmplus/sjasm/sjio.cpp"
                ,0x33c,"void ReadBufLine(bool, bool)");
}

Assistant:

void ReadBufLine(bool Parse, bool SplitByColon) {
	// if everything else fails (no data, not running, etc), return empty line
	*line = 0;
	bool IsLabel = true;
	// try to read through the buffer and produce new line from it
	while (IsRunning && ReadBufData()) {
		// start of new line (or fake "line" by colon)
		rlppos = line;
		substitutedLine = line;		// also reset "substituted" line to the raw new one
		eolComment = NULL;
		if (colonSubline) {			// starting from colon (creating new fake "line")
			colonSubline = false;	// (can't happen inside block comment)
			*(rlppos++) = ' ';
			IsLabel = false;
		} else {					// starting real new line
			IsLabel = (0 == blockComment);
		}
		bool afterNonAlphaNum, afterNonAlphaNumNext = true;
		// copy data from read buffer into `line` buffer until EOL/colon is found
		while (
				ReadBufData() && '\n' != *rlpbuf && '\r' != *rlpbuf &&	// split by EOL
				// split by colon only on 2nd+ char && SplitByColon && not inside block comment
				(blockComment || !SplitByColon || rlppos == line || ':' != *rlpbuf)) {
			// copy the new character to new line
			*rlppos = *rlpbuf++;
			afterNonAlphaNum = afterNonAlphaNumNext;
			afterNonAlphaNumNext = !isalnum((byte)*rlppos);
			// handle EOL escaping, limited implementation, usage not recommended
			if ('\\' == *rlppos && ReadBufData() && ('\r' == *rlpbuf || '\n' == *rlpbuf))  {
				char CRLFtest = (*rlpbuf++) ^ ('\r'^'\n');	// flip CR->LF || LF->CR (and eats first)
				if (ReadBufData() && CRLFtest == *rlpbuf) ++rlpbuf;	// if CRLF/LFCR pair, eat also second
				sourcePosStack.back().nextSegment();	// mark last line in errors/etc
				continue;								// continue with chars from next line
			}
			// Block comments logic first (anything serious may happen only "outside" of block comment
			if ('*' == *rlppos && ReadBufData() && '/' == *rlpbuf) {
				if (0 < blockComment) --blockComment;	// block comment ends here, -1 from nesting
				++rlppos;	*rlppos++ = *rlpbuf++;		// copy the second char too
				continue;
			}
			if ('/' == *rlppos && ReadBufData() && '*' == *rlpbuf) {
				++rlppos, ++blockComment;				// block comment starts here, nest +1 more
				*rlppos++ = *rlpbuf++;					// copy the second char too
				continue;
			}
			if (blockComment) {							// inside block comment just copy chars
				++rlppos;
				continue;
			}
			// check if still in label area, if yes, copy the finishing colon as char (don't split by it)
			if ((IsLabel = (IsLabel && islabchar(*rlppos)))) {
				++rlppos;					// label character
				//SMC offset handling
				if (ReadBufData() && '+' == *rlpbuf) {	// '+' after label, add it as SMC_offset syntax
					IsLabel = false;
					*rlppos++ = *rlpbuf++;
					if (ReadBufData() && (isdigit(byte(*rlpbuf)) || '*' == *rlpbuf)) *rlppos++ = *rlpbuf++;
				}
				if (ReadBufData() && ':' == *rlpbuf) {	// colon after label, add it
					*rlppos++ = *rlpbuf++;
					IsLabel = false;
				}
				continue;
			}
			// not in label any more, check for EOL comments ";" or "//"
			if ((';' == *rlppos) || ('/' == *rlppos && ReadBufData() && '/' == *rlpbuf)) {
				eolComment = rlppos;
				++rlppos;					// EOL comment ";"
				while (ReadBufData() && '\n' != *rlpbuf && '\r' != *rlpbuf) *rlppos++ = *rlpbuf++;
				continue;
			}
			// check for string literals - double/single quotes
			if (afterNonAlphaNum && ('"' == *rlppos || '\'' == *rlppos)) {
				const bool quotes = '"' == *rlppos;
				int escaped = 0;
				do {
					if (escaped) --escaped;
					++rlppos;				// previous char confirmed
					*rlppos = ReadBufData() ? *rlpbuf : 0;	// copy next char (if available)
					if (!*rlppos || '\r' == *rlppos || '\n' == *rlppos) *rlppos = 0;	// not valid
					else ++rlpbuf;			// buffer char read (accepted)
					if (quotes && !escaped && '\\' == *rlppos) escaped = 2;	// escape sequence detected
				} while (*rlppos && (escaped || (quotes ? '"' : '\'') != *rlppos));
				if (*rlppos) ++rlppos;		// there should be ending "/' in line buffer, confirm it
				continue;
			}
			// anything else just copy
			++rlppos;				// previous char confirmed
		} // while "some char in buffer, and it's not line delimiter"
		// line interrupted somehow, may be correctly finished, check + finalize line and process it
		*rlppos = 0;
		// skip <EOL> char sequence in read buffer
		if (ReadBufData() && ('\r' == *rlpbuf || '\n' == *rlpbuf)) {
			char CRLFtest = (*rlpbuf++) ^ ('\r'^'\n');	// flip CR->LF || LF->CR (and eats first)
			if (ReadBufData() && CRLFtest == *rlpbuf) ++rlpbuf;	// if CRLF/LFCR pair, eat also second
			// if this was very last <EOL> in file (on non-empty line), add one more fake empty line
			if (!ReadBufData() && *line) *rlpbuf_end++ = '\n';	// to make listing files "as before"
		} else {
			// advance over single colon if that was the reason to terminate line parsing
			colonSubline = SplitByColon && ReadBufData() && (':' == *rlpbuf) && ++rlpbuf;
		}
		// do +1 for very first colon-segment only (rest is +1 due to artificial space at beginning)
		assert(!sourcePosStack.empty());
		size_t advanceColumns = colonSubline ? (0 == sourcePosStack.back().colEnd) + strlen(line) : 0;
		sourcePosStack.back().nextSegment(colonSubline, advanceColumns);
		// line is parsed and ready to be processed
		if (Parse) 	ParseLine();	// processed here in loop
		else 		return;			// processed externally
	} // while (IsRunning && ReadBufData())
}